

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  int *piVar3;
  void *__ptr;
  Allocator *pAVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  Layer *pLVar9;
  int _w;
  char cVar10;
  ParamDict pd;
  Mat local_78;
  
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  if (*(int *)(&this->field_0x160 + (long)p_Var2) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var2)) {
  case 1:
    pLVar9 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 2:
    pLVar9 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 3:
    pLVar9 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 4:
    pLVar9 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 5:
    pLVar9 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  case 6:
    pLVar9 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_78);
    break;
  default:
    pLVar9 = (Layer *)0x0;
    goto LAB_0044a48c;
  }
  ParamDict::~ParamDict((ParamDict *)&local_78);
LAB_0044a48c:
  if (pLVar9 != (Layer *)0x0) {
    (*pLVar9->_vptr_Layer[4])(pLVar9,opt);
  }
  this->activation = pLVar9;
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x178 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  _w = *(int *)(&this->field_0xd8 + (long)p_Var2) * *(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar1 = *(uint *)(&this->field_0x108 + (long)p_Var2);
  uVar5 = (long)*(int *)(&this->field_0x104 + (long)p_Var2) / (long)(int)uVar1;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)_w;
  if ((uVar1 == *(uint *)(&this->field_0xd0 + (long)p_Var2)) &&
     (uVar8 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                   (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var2) / (int)uVar1)) * uVar1,
     uVar8 == uVar1)) {
    cVar10 = '\x01';
    if (opt->use_packing_layout == true) {
      cVar10 = '\b';
      if ((uVar8 & 7) != 0) {
        cVar10 = ((uVar8 & 3) == 0) * '\x03' + '\x01';
      }
    }
    if (cVar10 != '\x01') {
      if (cVar10 == '\x04') {
        Mat::reshape(&local_78,
                     (Mat *)(&this->field_0x168 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]
                            ),_w,
                     *(int *)(&this->field_0x108 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]),(Allocator *)0x0);
        convert_packing(&local_78,&this->weight_data_tm,4,opt);
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (cVar10 == '\b') {
        p_Var2 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
        Mat::reshape(&local_78,(Mat *)(&this->field_0x168 + (long)p_Var2),_w,
                     *(int *)(&this->field_0x108 + (long)p_Var2),(Allocator *)0x0);
        convert_packing(&local_78,&this->weight_data_tm,8,opt);
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_0044a743;
    }
    p_Var2 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    if ((*(int *)(&this->field_0xd4 + (long)p_Var2) == 3) &&
       (((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3 &&
           (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) ||
        ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3 &&
           ((*(int *)(&this->field_0xdc + (long)p_Var2) == 1 &&
            (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)))) &&
          (*(int *)(&this->field_0xe4 + (long)p_Var2) == 2)) &&
         (*(int *)(&this->field_0xe8 + (long)p_Var2) == 2)))))) {
      if (p_Var2 != (_func_int *)0xfffffffffffffec0) {
        piVar3 = *(int **)(&this->field_0x170 + (long)p_Var2);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data_tm).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            __ptr = (this->weight_data_tm).data;
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar3 = *(int **)((long)(&this->field_0x168 + (long)p_Var2) + 8);
        (this->weight_data_tm).data = *(void **)(&this->field_0x168 + (long)p_Var2);
        (this->weight_data_tm).refcount = piVar3;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var2);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x180 + (long)p_Var2);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var2);
        uVar6 = *(undefined8 *)(&this->field_0x190 + (long)p_Var2);
        uVar7 = *(undefined8 *)((long)(&this->field_0x190 + (long)p_Var2) + 8);
        (this->weight_data_tm).dims = (int)uVar6;
        (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
        (this->weight_data_tm).h = (int)uVar7;
        (this->weight_data_tm).d = (int)((ulong)uVar7 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x1a0 + (long)p_Var2);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x1a8 + (long)p_Var2);
      }
      goto LAB_0044a743;
    }
  }
  create_group_ops(this,opt);
LAB_0044a743:
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    piVar3 = *(int **)(&this->field_0x170 + (long)p_Var2);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x188 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x168 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x168 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x1a0 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}